

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

color_quad_u8 __thiscall crnlib::dxt_image::get_pixel(dxt_image *this,uint x,uint y)

{
  char cVar1;
  uchar uVar2;
  uint x_00;
  uint y_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  dxt1_block *this_00;
  dxt5_block *this_01;
  dxt3_block *this_02;
  uchar *puVar8;
  uint in_ECX;
  uint in_EDX;
  dxt_image *in_RSI;
  color_quad<unsigned_char,_int> *in_RDI;
  dxt3_block *pBlock_2;
  int comp_index_1;
  uint s_1;
  uint h_1;
  uint l_1;
  dxt5_block *pBlock_1;
  int comp_index;
  uint s;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint h;
  uint l;
  dxt1_block *pBlock;
  uint selector_index;
  uint by;
  uint bx;
  uint16 base_color4_1;
  uint16 base_color4_0;
  uint16 delta_color3;
  uint16 base_color5;
  color_quad_u8 subblock_colors1 [4];
  color_quad_u8 subblock_colors0 [4];
  uint table_index1;
  uint table_index0;
  bool flip_flag;
  bool diff_flag;
  etc1_block *block;
  uint element_index;
  element *pElement;
  uint block_y;
  uint block_x;
  color_quad_u8 *result;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  color_quad<unsigned_char,_int> *in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffecc;
  etc1_block *in_stack_fffffffffffffed0;
  ulong in_stack_fffffffffffffee8;
  color_quad_u8 *this_03;
  color_quad<unsigned_char,_int> *pcVar9;
  color_quad<unsigned_char,_int> *pDst;
  color_quad<unsigned_char,_int> *local_e8;
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_94;
  byte local_93;
  byte local_92;
  color_quad<unsigned_char,_int> local_68 [4];
  color_quad<unsigned_char,_int> local_58 [4];
  color_quad<unsigned_char,_int> cStack_48;
  uint local_44;
  uint local_40;
  byte local_3a;
  byte local_39;
  etc1_block *local_38;
  uint local_2c;
  element *local_28;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  uchar uVar3;
  
  local_1c = in_EDX >> 2;
  local_20 = in_ECX >> 2;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_28 = get_element(in_RSI,local_1c,local_20,0);
  color_quad<unsigned_char,_int>::color_quad
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,0,
             0x218eba);
  for (local_2c = 0; local_2c < in_RSI->m_num_elements_per_block; local_2c = local_2c + 1) {
    switch(in_RSI->m_element_type[local_2c]) {
    case cColorDXT1:
      this_00 = (dxt1_block *)get_element(in_RSI,local_1c,local_20,local_2c);
      uVar4 = dxt1_block::get_low_color(this_00);
      uVar5 = dxt1_block::get_high_color(this_00);
      dxt1_block::unpack_color
                ((uint16)(in_stack_fffffffffffffee8 >> 0x30),
                 SUB81(in_stack_fffffffffffffee8 >> 0x28,0),(uint)in_stack_fffffffffffffee8);
      dxt1_block::unpack_color
                ((uint16)(in_stack_fffffffffffffee8 >> 0x30),
                 SUB81(in_stack_fffffffffffffee8 >> 0x28,0),(uint)in_stack_fffffffffffffee8);
      uVar6 = dxt1_block::get_selector(this_00,local_14 & 3,local_18 & 3);
      if (uVar5 < uVar4) {
        in_stack_fffffffffffffee8 = (ulong)uVar6;
        switch(in_stack_fffffffffffffee8) {
        case 0:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,(uint)local_94,(uint)local_93,(uint)local_92);
          break;
        case 1:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,(uint)local_98,(uint)local_97,(uint)local_96);
          break;
        case 2:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,((uint)local_94 * 2 + (uint)local_98) / 3,
                     ((uint)local_93 * 2 + (uint)local_97) / 3,
                     ((uint)local_92 * 2 + (uint)local_96) / 3);
          break;
        case 3:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,((uint)local_98 * 2 + (uint)local_94) / 3,
                     ((uint)local_97 * 2 + (uint)local_93) / 3,
                     ((uint)local_96 * 2 + (uint)local_92) / 3);
        }
      }
      else {
        switch(uVar6) {
        case 0:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,(uint)local_94,(uint)local_93,(uint)local_92);
          break;
        case 1:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,(uint)local_98,(uint)local_97,(uint)local_96);
          break;
        case 2:
          color_quad<unsigned_char,_int>::set_noclamp_rgb
                    (in_RDI,(int)((uint)local_94 + (uint)local_98) >> 1,
                     (int)((uint)local_93 + (uint)local_97) >> 1,
                     (int)((uint)local_92 + (uint)local_96) >> 1);
          break;
        case 3:
          if (in_RSI->m_format < cDXT3) {
            color_quad<unsigned_char,_int>::set_noclamp_rgba(in_RDI,0,0,0,0);
          }
          else {
            color_quad<unsigned_char,_int>::set_noclamp_rgb(in_RDI,0,0,0);
          }
        }
      }
      break;
    case cAlphaDXT3:
      cVar1 = in_RSI->m_element_component_index[local_2c];
      this_02 = (dxt3_block *)get_element(in_RSI,local_1c,local_20,local_2c);
      uVar4 = dxt3_block::get_alpha(this_02,local_14 & 3,local_18 & 3,true);
      uVar2 = (uchar)uVar4;
      puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,(int)cVar1);
      *puVar8 = uVar2;
      break;
    case cAlphaDXT5:
      uVar4 = (uint)in_RSI->m_element_component_index[local_2c];
      this_01 = (dxt5_block *)get_element(in_RSI,local_1c,local_20,local_2c);
      uVar5 = dxt5_block::get_low_alpha(this_01);
      uVar6 = dxt5_block::get_high_alpha(this_01);
      uVar7 = dxt5_block::get_selector(this_01,local_14 & 3,local_18 & 3);
      uVar2 = (uchar)uVar5;
      uVar3 = (uchar)uVar6;
      if (uVar6 < uVar5) {
        in_stack_fffffffffffffed0 = (etc1_block *)(ulong)uVar7;
        switch(in_stack_fffffffffffffed0) {
        case (etc1_block *)0x0:
          in_stack_fffffffffffffecc = CONCAT13(uVar2,(int3)in_stack_fffffffffffffecc);
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)(in_stack_fffffffffffffecc >> 0x18);
          break;
        case (etc1_block *)0x1:
          in_stack_fffffffffffffecc =
               CONCAT13((char)(in_stack_fffffffffffffecc >> 0x18),
                        CONCAT12(uVar3,(short)in_stack_fffffffffffffecc));
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)(in_stack_fffffffffffffecc >> 0x10);
          break;
        case (etc1_block *)0x2:
          in_stack_fffffffffffffecc =
               CONCAT22((short)(in_stack_fffffffffffffecc >> 0x10),
                        CONCAT11((char)((ulong)(uVar5 * 6 + uVar6) / 7),
                                 (char)in_stack_fffffffffffffecc));
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)(in_stack_fffffffffffffecc >> 8);
          break;
        case (etc1_block *)0x3:
          in_stack_fffffffffffffecc =
               CONCAT31((int3)(in_stack_fffffffffffffecc >> 8),
                        (char)((ulong)(uVar5 * 5 + uVar6 * 2) / 7));
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)in_stack_fffffffffffffecc;
          break;
        case (etc1_block *)0x4:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)((ulong)(uVar5 * 4 + uVar6 * 3) / 7);
          break;
        case (etc1_block *)0x5:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)((ulong)(uVar5 * 3 + uVar6 * 4) / 7);
          break;
        case (etc1_block *)0x6:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)((ulong)(uVar5 * 2 + uVar6 * 5) / 7);
          break;
        case (etc1_block *)0x7:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = (uchar)((ulong)(uVar5 + uVar6 * 6) / 7);
        }
      }
      else {
        switch(uVar7) {
        case 0:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = uVar2;
          break;
        case 1:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = uVar3;
          break;
        case 2:
          uVar2 = (uchar)((ulong)(uVar5 * 4 + uVar6) / 5);
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = uVar2;
          break;
        case 3:
          uVar2 = (uchar)((ulong)(uVar5 * 3 + uVar6 * 2) / 5);
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = uVar2;
          break;
        case 4:
          uVar2 = (uchar)((ulong)(uVar5 * 2 + uVar6 * 3) / 5);
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = uVar2;
          break;
        case 5:
          uVar2 = (uchar)((ulong)(uVar5 + uVar6 * 4) / 5);
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = uVar2;
          break;
        case 6:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = '\0';
          break;
        case 7:
          puVar8 = color_quad<unsigned_char,_int>::operator[](in_RDI,uVar4);
          *puVar8 = 0xff;
        }
      }
      break;
    case cColorETC1:
      local_38 = (etc1_block *)get_element(in_RSI,local_1c,local_20,local_2c);
      local_39 = etc1_block::get_diff_bit(local_38);
      local_3a = etc1_block::get_flip_bit(local_38);
      local_40 = etc1_block::get_inten_table(local_38,0);
      local_44 = etc1_block::get_inten_table(local_38,1);
      local_e8 = local_58;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_e8);
        local_e8 = local_e8 + 1;
      } while (local_e8 != &cStack_48);
      pcVar9 = local_58;
      pDst = local_68;
      do {
        this_03 = pDst;
        color_quad<unsigned_char,_int>::color_quad(this_03);
        pDst = this_03 + 1;
      } while (pDst != pcVar9);
      if ((local_39 & 1) == 0) {
        etc1_block::get_base4_color(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        etc1_block::get_abs_subblock_colors
                  (this_03,(uint16)(in_stack_fffffffffffffee8 >> 0x30),
                   (uint)in_stack_fffffffffffffee8);
        etc1_block::get_base4_color(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        etc1_block::get_abs_subblock_colors
                  (this_03,(uint16)(in_stack_fffffffffffffee8 >> 0x30),
                   (uint)in_stack_fffffffffffffee8);
      }
      else {
        etc1_block::get_base5_color(in_stack_fffffffffffffed0);
        etc1_block::get_delta3_color(in_stack_fffffffffffffed0);
        etc1_block::get_diff_subblock_colors
                  (this_03,(uint16)(in_stack_fffffffffffffee8 >> 0x30),
                   (uint)in_stack_fffffffffffffee8);
        etc1_block::get_diff_subblock_colors
                  (pDst,(uint16)((ulong)pcVar9 >> 0x30),(uint16)((ulong)pcVar9 >> 0x20),(uint)pcVar9
                  );
      }
      x_00 = local_14 & 3;
      y_00 = local_18 & 3;
      uVar4 = etc1_block::get_selector(local_38,x_00,y_00);
      if ((local_3a & 1) == 0) {
        if (x_00 < 3) {
          color_quad<unsigned_char,_int>::operator=(in_RDI,local_58 + uVar4);
        }
        else {
          color_quad<unsigned_char,_int>::operator=(in_RDI,local_68 + uVar4);
        }
      }
      else if (y_00 < 3) {
        color_quad<unsigned_char,_int>::operator=(in_RDI,local_58 + uVar4);
      }
      else {
        color_quad<unsigned_char,_int>::operator=(in_RDI,local_68 + uVar4);
      }
    }
    local_28 = local_28 + 1;
  }
  return (color_quad_u8)SUB84(in_RDI,0);
}

Assistant:

color_quad_u8 dxt_image::get_pixel(uint x, uint y) const {
  CRNLIB_ASSERT((x < m_width) && (y < m_height));

  const uint block_x = x >> cDXTBlockShift;
  const uint block_y = y >> cDXTBlockShift;

  const element* pElement = reinterpret_cast<const element*>(&get_element(block_x, block_y, 0));

  color_quad_u8 result(0, 0, 0, 255);

  for (uint element_index = 0; element_index < m_num_elements_per_block; element_index++, pElement++) {
    switch (m_element_type[element_index]) {
      case cColorETC1: {
        const etc1_block& block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));

        const bool diff_flag = block.get_diff_bit();
        const bool flip_flag = block.get_flip_bit();
        const uint table_index0 = block.get_inten_table(0);
        const uint table_index1 = block.get_inten_table(1);
        color_quad_u8 subblock_colors0[4], subblock_colors1[4];

        if (diff_flag) {
          const uint16 base_color5 = block.get_base5_color();
          const uint16 delta_color3 = block.get_delta3_color();
          etc1_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);
          etc1_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1);
        } else {
          const uint16 base_color4_0 = block.get_base4_color(0);
          etc1_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);
          const uint16 base_color4_1 = block.get_base4_color(1);
          etc1_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
        }

        const uint bx = x & 3;
        const uint by = y & 3;

        const uint selector_index = block.get_selector(bx, by);
        if (flip_flag) {
          if (by <= 2)
            result = subblock_colors0[selector_index];
          else
            result = subblock_colors1[selector_index];
        } else {
          if (bx <= 2)
            result = subblock_colors0[selector_index];
          else
            result = subblock_colors1[selector_index];
        }

        break;
      }
      case cColorDXT1: {
        const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

        const uint l = pBlock->get_low_color();
        const uint h = pBlock->get_high_color();

        color_quad_u8 c0(dxt1_block::unpack_color(static_cast<uint16>(l), true));
        color_quad_u8 c1(dxt1_block::unpack_color(static_cast<uint16>(h), true));

        const uint s = pBlock->get_selector(x & 3, y & 3);

        if (l > h) {
          switch (s) {
            case 0:
              result.set_noclamp_rgb(c0.r, c0.g, c0.b);
              break;
            case 1:
              result.set_noclamp_rgb(c1.r, c1.g, c1.b);
              break;
            case 2:
              result.set_noclamp_rgb((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3);
              break;
            case 3:
              result.set_noclamp_rgb((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3);
              break;
          }
        } else {
          switch (s) {
            case 0:
              result.set_noclamp_rgb(c0.r, c0.g, c0.b);
              break;
            case 1:
              result.set_noclamp_rgb(c1.r, c1.g, c1.b);
              break;
            case 2:
              result.set_noclamp_rgb((c0.r + c1.r) >> 1U, (c0.g + c1.g) >> 1U, (c0.b + c1.b) >> 1U);
              break;
            case 3: {
              if (m_format <= cDXT1A)
                result.set_noclamp_rgba(0, 0, 0, 0);
              else
                result.set_noclamp_rgb(0, 0, 0);
              break;
            }
          }
        }

        break;
      }
      case cAlphaDXT5: {
        const int comp_index = m_element_component_index[element_index];

        const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

        const uint l = pBlock->get_low_alpha();
        const uint h = pBlock->get_high_alpha();

        const uint s = pBlock->get_selector(x & 3, y & 3);

        if (l > h) {
          switch (s) {
            case 0:
              result[comp_index] = static_cast<uint8>(l);
              break;
            case 1:
              result[comp_index] = static_cast<uint8>(h);
              break;
            case 2:
              result[comp_index] = static_cast<uint8>((l * 6 + h) / 7);
              break;
            case 3:
              result[comp_index] = static_cast<uint8>((l * 5 + h * 2) / 7);
              break;
            case 4:
              result[comp_index] = static_cast<uint8>((l * 4 + h * 3) / 7);
              break;
            case 5:
              result[comp_index] = static_cast<uint8>((l * 3 + h * 4) / 7);
              break;
            case 6:
              result[comp_index] = static_cast<uint8>((l * 2 + h * 5) / 7);
              break;
            case 7:
              result[comp_index] = static_cast<uint8>((l + h * 6) / 7);
              break;
          }
        } else {
          switch (s) {
            case 0:
              result[comp_index] = static_cast<uint8>(l);
              break;
            case 1:
              result[comp_index] = static_cast<uint8>(h);
              break;
            case 2:
              result[comp_index] = static_cast<uint8>((l * 4 + h) / 5);
              break;
            case 3:
              result[comp_index] = static_cast<uint8>((l * 3 + h * 2) / 5);
              break;
            case 4:
              result[comp_index] = static_cast<uint8>((l * 2 + h * 3) / 5);
              break;
            case 5:
              result[comp_index] = static_cast<uint8>((l + h * 4) / 5);
              break;
            case 6:
              result[comp_index] = 0;
              break;
            case 7:
              result[comp_index] = 255;
              break;
          }
        }

        break;
      }
      case cAlphaDXT3: {
        const int comp_index = m_element_component_index[element_index];

        const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

        result[comp_index] = static_cast<uint8>(pBlock->get_alpha(x & 3, y & 3, true));

        break;
      }
      default:
        break;
    }
  }

  return result;
}